

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close.c
# Opt level: O2

int run_test_tcp_close(void)

{
  int iVar1;
  undefined8 uVar2;
  void *pvVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b_1;
  int64_t eval_b;
  int64_t eval_b_2;
  sockaddr_in addr;
  uv_tcp_t tcp_server;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  tcp_server.data = (void *)(long)iVar1;
  eval_b = 0;
  if (tcp_server.data == (void *)0x0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&eval_b);
    tcp_server.data = (void *)(long)iVar1;
    if (tcp_server.data == (void *)0x0) {
      iVar1 = uv_tcp_init(uVar2,&tcp_server);
      eval_b_1 = (int64_t)iVar1;
      eval_b_2 = 0;
      if (eval_b_1 == 0) {
        iVar1 = uv_tcp_bind(&tcp_server,&eval_b,0);
        eval_b_1 = (int64_t)iVar1;
        eval_b_2 = 0;
        if (eval_b_1 == 0) {
          iVar1 = uv_listen(&tcp_server,0x80,connection_cb);
          eval_b_1 = (int64_t)iVar1;
          eval_b_2 = 0;
          if (eval_b_1 == 0) {
            uv_unref(&tcp_server);
            iVar1 = uv_tcp_init(uVar2,&tcp_handle);
            eval_b = (int64_t)iVar1;
            if (eval_b == 0) {
              iVar1 = uv_tcp_connect(&connect_req,&tcp_handle,&addr,connect_cb);
              eval_b = (int64_t)iVar1;
              if (eval_b == 0) {
                eval_b = (int64_t)write_cb_called;
                if (eval_b == 0) {
                  eval_b = (int64_t)close_cb_called;
                  if (eval_b == 0) {
                    iVar1 = uv_run(uVar2,0);
                    eval_b = (int64_t)iVar1;
                    if (eval_b == 0) {
                      printf("%d of %d write reqs seen\n",(ulong)(uint)write_cb_called,0x20);
                      pvVar3 = (void *)(long)write_cb_called;
                      eval_b_1 = 0x20;
                      if (pvVar3 == (void *)0x20) {
                        eval_b = 1;
                        eval_b_1 = (int64_t)close_cb_called;
                        if (eval_b_1 == 1) {
                          uv_walk(uVar2,close_walk_cb,0);
                          uv_run(uVar2,0);
                          eval_b = 0;
                          iVar1 = uv_loop_close(uVar2);
                          eval_b_1 = (int64_t)iVar1;
                          if (eval_b == eval_b_1) {
                            uv_library_shutdown();
                            return 0;
                          }
                          pcVar5 = "uv_loop_close(loop)";
                          pcVar4 = "0";
                          uVar2 = 0x86;
                          pvVar3 = (void *)eval_b;
                        }
                        else {
                          pcVar5 = "close_cb_called";
                          pcVar4 = "1";
                          uVar2 = 0x84;
                          pvVar3 = (void *)eval_b;
                        }
                      }
                      else {
                        pcVar5 = "32";
                        pcVar4 = "write_cb_called";
                        uVar2 = 0x83;
                        eval_b = (int64_t)pvVar3;
                      }
                      goto LAB_0018760a;
                    }
                    pcVar4 = "r";
                    uVar2 = 0x7f;
                  }
                  else {
                    pcVar4 = "close_cb_called";
                    uVar2 = 0x7c;
                  }
                }
                else {
                  pcVar4 = "write_cb_called";
                  uVar2 = 0x7b;
                }
              }
              else {
                pcVar4 = "r";
                uVar2 = 0x79;
              }
            }
            else {
              pcVar4 = "r";
              uVar2 = 0x73;
            }
            eval_b_1 = 0;
            pcVar5 = "0";
            pvVar3 = (void *)eval_b;
            goto LAB_0018760a;
          }
          uVar2 = 0x5c;
        }
        else {
          uVar2 = 0x59;
        }
      }
      else {
        uVar2 = 0x56;
      }
      eval_b_2 = 0;
      pcVar5 = "0";
      pcVar4 = "r";
      pvVar3 = (void *)eval_b_1;
      eval_b_1 = 0;
      goto LAB_0018760a;
    }
    uVar2 = 0x53;
  }
  else {
    uVar2 = 0x6b;
  }
  eval_b_1 = 0;
  pcVar5 = "0";
  pcVar4 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
  pvVar3 = tcp_server.data;
LAB_0018760a:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close.c"
          ,uVar2,pcVar4,"==",pcVar5,pvVar3,"==",eval_b_1);
  abort();
}

Assistant:

TEST_IMPL(tcp_close) {
  struct sockaddr_in addr;
  uv_tcp_t tcp_server;
  uv_loop_t* loop;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  loop = uv_default_loop();

  /* We can't use the echo server, it doesn't handle ECONNRESET. */
  start_server(loop, &tcp_server);

  r = uv_tcp_init(loop, &tcp_handle);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &tcp_handle,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT_OK(r);

  ASSERT_OK(write_cb_called);
  ASSERT_OK(close_cb_called);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  printf("%d of %d write reqs seen\n", write_cb_called, NUM_WRITE_REQS);

  ASSERT_EQ(write_cb_called, NUM_WRITE_REQS);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}